

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_enctropy.c
# Opt level: O2

void h265e_cabac_finish(H265eCabacCtx *cabac_ctx)

{
  MppWriteCtx *ctx;
  int iVar1;
  uint uVar2;
  
  ctx = cabac_ctx->m_bitIf;
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_cabac","enter\n","h265e_cabac_finish");
  }
  if (cabac_ctx->m_low >> ((char)cabac_ctx->m_bitsLeft + 0x15U & 0x1f) == 0) {
    iVar1 = cabac_ctx->m_numBufferedBytes;
    if (0 < iVar1) {
      mpp_writer_put_bits(ctx,cabac_ctx->m_bufferedByte,8);
      iVar1 = cabac_ctx->m_numBufferedBytes;
    }
    while (1 < iVar1) {
      mpp_writer_put_bits(ctx,0xff,8);
      iVar1 = cabac_ctx->m_numBufferedBytes + -1;
      cabac_ctx->m_numBufferedBytes = iVar1;
    }
    uVar2 = cabac_ctx->m_low;
    iVar1 = cabac_ctx->m_bitsLeft;
  }
  else {
    mpp_writer_put_bits(ctx,cabac_ctx->m_bufferedByte + 1,8);
    iVar1 = cabac_ctx->m_numBufferedBytes;
    while (1 < iVar1) {
      mpp_writer_put_bits(ctx,0,8);
      iVar1 = cabac_ctx->m_numBufferedBytes + -1;
      cabac_ctx->m_numBufferedBytes = iVar1;
    }
    iVar1 = cabac_ctx->m_bitsLeft;
    uVar2 = (-1 << ((char)iVar1 + 0x15U & 0x1f)) + cabac_ctx->m_low;
    cabac_ctx->m_low = uVar2;
  }
  mpp_writer_put_bits(ctx,uVar2 >> 8,iVar1 + 0xd);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_cabac","leave\n","h265e_cabac_finish");
    return;
  }
  return;
}

Assistant:

void h265e_cabac_finish(H265eCabacCtx *cabac_ctx)
{
    MppWriteCtx* s = cabac_ctx->m_bitIf;

    h265e_dbg_func("enter\n");

    if (cabac_ctx->m_low >> (21 + cabac_ctx->m_bitsLeft)) {

        mpp_writer_put_bits(s, cabac_ctx->m_bufferedByte + 1, 8);
        while (cabac_ctx->m_numBufferedBytes > 1) {
            mpp_writer_put_bits(s, 0, 8);
            cabac_ctx->m_numBufferedBytes--;
        }

        cabac_ctx->m_low -= 1 << (21 + cabac_ctx->m_bitsLeft);
    } else {
        if (cabac_ctx->m_numBufferedBytes > 0) {

            mpp_writer_put_bits(s, cabac_ctx->m_bufferedByte , 8);
        }
        while (cabac_ctx->m_numBufferedBytes > 1) {
            mpp_writer_put_bits(s, 0xff , 8);
            cabac_ctx->m_numBufferedBytes--;
        }
    }
    mpp_writer_put_bits(s, cabac_ctx->m_low >> 8 , 13 + cabac_ctx->m_bitsLeft);

    h265e_dbg_func("leave\n");
}